

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

void __thiscall
soul::StructuralParser::parseTopLevelDecl(StructuralParser *this,Namespace *parentNamespace)

{
  bool bVar1;
  CompileMessage local_118;
  CompileMessage local_e0;
  char *local_a8;
  undefined1 local_a0 [24];
  UTF8Reader local_88;
  undefined1 local_80 [24];
  UTF8Reader local_68;
  undefined4 local_5c;
  undefined1 local_58 [40];
  Scope local_30;
  undefined1 local_28 [8];
  CodeLocation keywordLocation;
  Namespace *parentNamespace_local;
  StructuralParser *this_local;
  
  keywordLocation.location.data = (char *)parentNamespace;
  parseImports(this,parentNamespace);
  CodeLocation::CodeLocation((CodeLocation *)local_28,&(this->super_SOULTokeniser).location);
  local_30._vptr_Scope = (_func_int **)0x4d0889;
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x4d0889);
  if (bVar1) {
    CodeLocation::CodeLocation((CodeLocation *)local_58,(CodeLocation *)local_28);
    parseProcessorDecl((StructuralParser *)(local_58 + 0x10),(CodeLocation *)this,
                       (Namespace *)local_58);
    pool_ptr<soul::AST::Processor>::~pool_ptr((pool_ptr<soul::AST::Processor> *)(local_58 + 0x10));
    CodeLocation::~CodeLocation((CodeLocation *)local_58);
    local_5c = 1;
  }
  else {
    local_68.data = "graph";
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x4d2459);
    if (bVar1) {
      CodeLocation::CodeLocation((CodeLocation *)local_80,(CodeLocation *)local_28);
      parseGraphDecl((StructuralParser *)(local_80 + 0x10),(CodeLocation *)this,
                     (Namespace *)local_80);
      pool_ptr<soul::AST::Graph>::~pool_ptr((pool_ptr<soul::AST::Graph> *)(local_80 + 0x10));
      CodeLocation::~CodeLocation((CodeLocation *)local_80);
      local_5c = 1;
    }
    else {
      local_88.data = "namespace";
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x4d027d);
      if (bVar1) {
        CodeLocation::CodeLocation((CodeLocation *)local_a0,(CodeLocation *)local_28);
        parseNamespaceDecl((StructuralParser *)(local_a0 + 0x10),(CodeLocation *)this,
                           (ModuleBase *)local_a0);
        pool_ptr<soul::AST::Namespace>::~pool_ptr
                  ((pool_ptr<soul::AST::Namespace> *)(local_a0 + 0x10));
        CodeLocation::~CodeLocation((CodeLocation *)local_a0);
        local_5c = 1;
      }
      else {
        local_a8 = "import";
        bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matches(&this->super_SOULTokeniser,(TokenType)"import");
        if (bVar1) {
          Errors::importsMustBeAtStart<>();
          (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_e0);
          CompileMessage::~CompileMessage(&local_e0);
        }
        Errors::expectedTopLevelDecl<>();
        (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_118);
        CompileMessage::~CompileMessage(&local_118);
        local_5c = 0;
      }
    }
  }
  CodeLocation::~CodeLocation((CodeLocation *)local_28);
  return;
}

Assistant:

void parseTopLevelDecl (AST::Namespace& parentNamespace)
    {
        parseImports (parentNamespace);
        auto keywordLocation = location;

        if (matchIf (Keyword::processor))      { parseProcessorDecl (keywordLocation, parentNamespace); return; }
        if (matchIf (Keyword::graph))          { parseGraphDecl     (keywordLocation, parentNamespace); return; }
        if (matchIf (Keyword::namespace_))     { parseNamespaceDecl (keywordLocation, parentNamespace); return; }
        if (matches (Keyword::import))         throwError (Errors::importsMustBeAtStart());

        throwError (Errors::expectedTopLevelDecl());
    }